

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satSolver.c
# Opt level: O3

int sat_solver_minimize_assumptions2(sat_solver *s,int *pLits,int nLits,int nConfLimit)

{
  ABC_INT64_T AVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  int *piVar5;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  uint uVar10;
  int LitNot_2;
  int LitNot_1;
  int LitNot;
  uint local_44;
  uint local_40;
  uint local_3c;
  int *local_38;
  
  if (nLits == 1) {
    if (-1 < *pLits) {
      local_3c = *pLits ^ 1;
      AVar1 = s->nConfLimit;
      s->nConfLimit = (long)nConfLimit;
      iVar2 = sat_solver_push(s,local_3c);
      if (iVar2 == 0) {
        __assert_fail("RetValue",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satSolver.c"
                      ,0x8f6,"int sat_solver_minimize_assumptions2(sat_solver *, int *, int, int)");
      }
      iVar2 = sat_solver_solve_internal(s);
      sat_solver_pop(s);
      if ((iVar2 == -1) &&
         (iVar3 = sat_solver_addclause(s,(lit *)&local_3c,(lit *)&local_38), iVar3 == 0)) {
        __assert_fail("RetValue",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satSolver.c"
                      ,0x8fe,"int sat_solver_minimize_assumptions2(sat_solver *, int *, int, int)");
      }
      s->nConfLimit = (long)(int)AVar1;
      return (uint)(iVar2 != -1);
    }
LAB_0055a01f:
    __assert_fail("Lit >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                  ,0x131,"int Abc_LitNot(int)");
  }
  if (nLits < 2) {
    __assert_fail("nLits >= 2",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satSolver.c"
                  ,0x904,"int sat_solver_minimize_assumptions2(sat_solver *, int *, int, int)");
  }
  uVar10 = (uint)nLits >> 1;
  uVar8 = (ulong)uVar10;
  uVar9 = 0;
  do {
    iVar2 = sat_solver_push(s,pLits[uVar9]);
    if (iVar2 == 0) {
      uVar7 = (uint)(uVar9 + 1);
      uVar8 = uVar9 + 1 & 0xffffffff;
      do {
        sat_solver_pop(s);
        iVar2 = (int)uVar8;
        uVar4 = iVar2 - 1;
        uVar8 = (ulong)uVar4;
      } while (uVar4 != 0 && 0 < iVar2);
      if ((uint)uVar9 < uVar10) goto LAB_0055a003;
      while (-1 < pLits[uVar9]) {
        local_40 = pLits[uVar9] ^ 1;
        iVar2 = sat_solver_addclause(s,(lit *)&local_40,(lit *)&local_3c);
        if (iVar2 == 0) {
          __assert_fail("RetValue",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satSolver.c"
                        ,0x913,"int sat_solver_minimize_assumptions2(sat_solver *, int *, int, int)"
                       );
        }
        if (uVar7 < uVar10) goto LAB_0055a003;
      }
      goto LAB_0055a01f;
    }
    uVar9 = uVar9 + 1;
  } while (uVar8 != uVar9);
  local_38 = pLits + uVar8;
  uVar4 = sat_solver_minimize_assumptions2(s,local_38,nLits - uVar10,nConfLimit);
  uVar7 = uVar10;
  do {
    sat_solver_pop(s);
    uVar7 = uVar7 - 1;
  } while (uVar7 != 0);
  if ((s->temp_clause).size < 0) {
    __assert_fail("k <= v->size",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satVec.h"
                  ,0x30,"void veci_resize(veci *, int)");
  }
  (s->temp_clause).size = 0;
  piVar5 = (s->temp_clause).ptr;
  uVar9 = 0;
  do {
    iVar2 = pLits[uVar9];
    uVar7 = (s->temp_clause).size;
    if (uVar7 == (s->temp_clause).cap) {
      iVar3 = (uVar7 >> 1) * 3;
      if ((int)uVar7 < 4) {
        iVar3 = uVar7 * 2;
      }
      if (piVar5 == (int *)0x0) {
        piVar5 = (int *)malloc((long)iVar3 << 2);
      }
      else {
        piVar5 = (int *)realloc(piVar5,(long)iVar3 << 2);
      }
      (s->temp_clause).ptr = piVar5;
      if (piVar5 == (int *)0x0) {
        printf("Failed to realloc memory from %.1f MB to %.1f MB.\n",
               (double)(s->temp_clause).cap * 9.5367431640625e-07,
               (double)iVar3 * 9.5367431640625e-07);
        fflush(_stdout);
      }
      (s->temp_clause).cap = iVar3;
      uVar7 = (s->temp_clause).size;
    }
    (s->temp_clause).size = uVar7 + 1;
    piVar5[(int)uVar7] = iVar2;
    uVar9 = uVar9 + 1;
  } while (uVar8 != uVar9);
  uVar9 = (ulong)uVar4;
  if (0 < (int)uVar4) {
    uVar6 = 0;
    do {
      pLits[uVar6] = local_38[uVar6];
      uVar6 = uVar6 + 1;
    } while (uVar9 != uVar6);
  }
  piVar5 = (s->temp_clause).ptr;
  uVar6 = 0;
  do {
    (pLits + (int)uVar4)[uVar6] = piVar5[uVar6];
    uVar6 = uVar6 + 1;
  } while (uVar8 != uVar6);
  if ((int)uVar4 < 1) {
    iVar2 = sat_solver_minimize_assumptions2(s,pLits + (int)uVar4,uVar10,nConfLimit);
  }
  else {
    uVar8 = 0;
    do {
      iVar2 = sat_solver_push(s,pLits[uVar8]);
      if (iVar2 == 0) {
        uVar7 = (uint)(uVar8 + 1);
        uVar9 = uVar8 + 1 & 0xffffffff;
        do {
          sat_solver_pop(s);
          iVar2 = (int)uVar9;
          uVar10 = iVar2 - 1;
          uVar9 = (ulong)uVar10;
        } while (uVar10 != 0 && 0 < iVar2);
        if ((int)uVar8 < (int)uVar4) {
LAB_0055a003:
          iVar2 = sat_solver_minimize_assumptions2(s,pLits,uVar7,nConfLimit);
          return iVar2;
        }
        while (-1 < pLits[uVar8]) {
          local_44 = pLits[uVar8] ^ 1;
          iVar2 = sat_solver_addclause(s,(lit *)&local_44,(lit *)&local_40);
          if (iVar2 == 0) {
            __assert_fail("RetValue",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satSolver.c"
                          ,0x931,
                          "int sat_solver_minimize_assumptions2(sat_solver *, int *, int, int)");
          }
          if ((int)uVar7 < (int)uVar4) goto LAB_0055a003;
        }
        goto LAB_0055a01f;
      }
      uVar8 = uVar8 + 1;
    } while (uVar9 != uVar8);
    iVar2 = sat_solver_minimize_assumptions2(s,pLits + uVar9,uVar10,nConfLimit);
    uVar10 = uVar4;
    if (0 < (int)uVar4) {
      do {
        sat_solver_pop(s);
        uVar10 = uVar10 - 1;
      } while (uVar10 != 0);
    }
  }
  return iVar2 + uVar4;
}

Assistant:

int sat_solver_minimize_assumptions2( sat_solver* s, int * pLits, int nLits, int nConfLimit )
{
    int i, k, nLitsL, nLitsR, nResL, nResR;
    if ( nLits == 1 )
    {
        // since the problem is UNSAT, we will try to solve it without assuming the last literal
        // if the result is UNSAT, the last literal can be dropped; otherwise, it is needed
        int RetValue = 1, LitNot = Abc_LitNot(pLits[0]);
        int status = l_False;
        int Temp = s->nConfLimit; 
        s->nConfLimit = nConfLimit;

        RetValue = sat_solver_push( s, LitNot ); assert( RetValue );
        status = sat_solver_solve_internal( s );
        sat_solver_pop( s );

        // if the problem is UNSAT, add clause
        if ( status == l_False )
        {
            RetValue = sat_solver_addclause( s, &LitNot, &LitNot+1 );
            assert( RetValue );
        }

        s->nConfLimit = Temp;
        return (int)(status != l_False); // return 1 if the problem is not UNSAT
    }
    assert( nLits >= 2 );
    nLitsL = nLits / 2;
    nLitsR = nLits - nLitsL;
    // assume the left lits
    for ( i = 0; i < nLitsL; i++ )
        if ( !sat_solver_push(s, pLits[i]) )
        {
            for ( k = i; k >= 0; k-- )
                sat_solver_pop(s);

            // add clauses for these literal
            for ( k = i+1; k > nLitsL; k++ )
            {
                int LitNot = Abc_LitNot(pLits[i]);
                int RetValue = sat_solver_addclause( s, &LitNot, &LitNot+1 );
                assert( RetValue );
            }

            return sat_solver_minimize_assumptions2( s, pLits, i+1, nConfLimit );
        }
    // solve for the right lits
    nResL = sat_solver_minimize_assumptions2( s, pLits + nLitsL, nLitsR, nConfLimit );
    for ( i = 0; i < nLitsL; i++ )
        sat_solver_pop(s);
    // swap literals
//    assert( nResL <= nLitsL );
    veci_resize( &s->temp_clause, 0 );
    for ( i = 0; i < nLitsL; i++ )
        veci_push( &s->temp_clause, pLits[i] );
    for ( i = 0; i < nResL; i++ )
        pLits[i] = pLits[nLitsL+i];
    for ( i = 0; i < nLitsL; i++ )
        pLits[nResL+i] = veci_begin(&s->temp_clause)[i];
    // assume the right lits
    for ( i = 0; i < nResL; i++ )
        if ( !sat_solver_push(s, pLits[i]) )
        {
            for ( k = i; k >= 0; k-- )
                sat_solver_pop(s);

            // add clauses for these literal
            for ( k = i+1; k > nResL; k++ )
            {
                int LitNot = Abc_LitNot(pLits[i]);
                int RetValue = sat_solver_addclause( s, &LitNot, &LitNot+1 );
                assert( RetValue );
            }

            return sat_solver_minimize_assumptions2( s, pLits, i+1, nConfLimit );
        }
    // solve for the left lits
    nResR = sat_solver_minimize_assumptions2( s, pLits + nResL, nLitsL, nConfLimit );
    for ( i = 0; i < nResL; i++ )
        sat_solver_pop(s);
    return nResL + nResR;
}